

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

CharIterator * __thiscall
absl::Cord::Find(CharIterator *__return_storage_ptr__,Cord *this,Cord *needle)

{
  byte bVar1;
  CharIterator it;
  CharIterator haystack;
  CharIterator haystack_00;
  CharIterator needle_end;
  CharIterator needle_end_00;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ChunkIterator *pCVar8;
  undefined8 *puVar9;
  CharIterator *pCVar10;
  undefined8 *puVar11;
  size_t *psVar12;
  size_t sVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  string_view needle_00;
  CharIterator needle_it;
  CharIterator haystack_advanced_it;
  CharIterator haystack_it;
  undefined1 in_stack_fffffffffffff9d8 [72];
  undefined1 in_stack_fffffffffffffa20 [80];
  undefined1 in_stack_fffffffffffffa70 [72];
  ChunkIterator in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffb50 [80];
  char *pcVar16;
  ulong in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  Nullable<absl::cord_internal::CordRep_*> in_stack_fffffffffffffbb8;
  ulong in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd4 [20];
  ChunkIterator local_3c0;
  ChunkIterator local_328;
  CharIterator local_290;
  undefined8 local_1f8 [5];
  undefined4 local_1d0;
  undefined8 local_160 [5];
  undefined4 local_138;
  CharIterator local_c8;
  
  bVar14 = 0;
  bVar1 = (needle->contents_).data_.rep_.field_0.data[0];
  uVar7 = (ulong)(char)bVar1;
  if ((uVar7 & 1) == 0) {
    uVar3 = uVar7 >> 1;
  }
  else {
    uVar3 = ((needle->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar3 == 0) goto LAB_00133d64;
  if ((bVar1 & 1) == 0) {
    sVar13 = uVar7 >> 1;
  }
  else {
    sVar13 = ((needle->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  bVar1 = (this->contents_).data_.rep_.field_0.data[0];
  uVar3 = (ulong)(char)bVar1;
  if ((uVar3 & 1) == 0) {
    uVar5 = uVar3 >> 1;
  }
  else {
    uVar5 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (sVar13 <= uVar5) {
    if ((bVar1 & 1) == 0) {
      uVar5 = uVar3 >> 1;
    }
    else {
      uVar5 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (sVar13 == uVar5) {
      auVar15[0] = -((needle->contents_).data_.rep_.field_0.data[0] ==
                    (this->contents_).data_.rep_.field_0.data[0]);
      auVar15[1] = -((needle->contents_).data_.rep_.field_0.data[1] ==
                    (this->contents_).data_.rep_.field_0.data[1]);
      auVar15[2] = -((needle->contents_).data_.rep_.field_0.data[2] ==
                    (this->contents_).data_.rep_.field_0.data[2]);
      auVar15[3] = -((needle->contents_).data_.rep_.field_0.data[3] ==
                    (this->contents_).data_.rep_.field_0.data[3]);
      auVar15[4] = -((needle->contents_).data_.rep_.field_0.data[4] ==
                    (this->contents_).data_.rep_.field_0.data[4]);
      auVar15[5] = -((needle->contents_).data_.rep_.field_0.data[5] ==
                    (this->contents_).data_.rep_.field_0.data[5]);
      auVar15[6] = -((needle->contents_).data_.rep_.field_0.data[6] ==
                    (this->contents_).data_.rep_.field_0.data[6]);
      auVar15[7] = -((needle->contents_).data_.rep_.field_0.data[7] ==
                    (this->contents_).data_.rep_.field_0.data[7]);
      auVar15[8] = -((needle->contents_).data_.rep_.field_0.data[8] ==
                    (this->contents_).data_.rep_.field_0.data[8]);
      auVar15[9] = -((needle->contents_).data_.rep_.field_0.data[9] ==
                    (this->contents_).data_.rep_.field_0.data[9]);
      auVar15[10] = -((needle->contents_).data_.rep_.field_0.data[10] ==
                     (this->contents_).data_.rep_.field_0.data[10]);
      auVar15[0xb] = -((needle->contents_).data_.rep_.field_0.data[0xb] ==
                      (this->contents_).data_.rep_.field_0.data[0xb]);
      auVar15[0xc] = -((needle->contents_).data_.rep_.field_0.data[0xc] ==
                      (this->contents_).data_.rep_.field_0.data[0xc]);
      auVar15[0xd] = -((needle->contents_).data_.rep_.field_0.data[0xd] ==
                      (this->contents_).data_.rep_.field_0.data[0xd]);
      auVar15[0xe] = -((needle->contents_).data_.rep_.field_0.data[0xe] ==
                      (this->contents_).data_.rep_.field_0.data[0xe]);
      auVar15[0xf] = -((needle->contents_).data_.rep_.field_0.data[0xf] ==
                      (this->contents_).data_.rep_.field_0.data[0xf]);
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar15[0xf] >> 7) << 0xf) != 0xffff) {
        if ((uVar7 & 1) == 0) {
          sVar13 = uVar7 >> 1;
        }
        else {
          sVar13 = ((needle->contents_).data_.rep_.field_0.as_tree.rep)->length;
        }
        if ((uVar3 & 1) == 0) {
          uVar3 = uVar3 >> 1;
        }
        else {
          uVar3 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
        }
        if ((uVar3 != sVar13) ||
           (bVar2 = GenericCompare<bool,absl::Cord>(this,needle,sVar13), !bVar2)) goto LAB_00133938;
      }
LAB_00133d64:
      CharIterator::CharIterator(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    CharIterator::CharIterator(&local_290,needle);
    if (local_290.chunk_iterator_.bytes_remaining_ == 0) {
      Find();
LAB_00133d89:
      __assert_fail("bytes_remaining_ >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x626,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
    }
    CharIterator::CharIterator((CharIterator *)&local_328,this);
    pcVar16 = local_290.chunk_iterator_.current_chunk_._M_str;
    do {
      pCVar8 = &local_328;
      psVar12 = (size_t *)&stack0xfffffffffffff9d8;
      for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
        *psVar12 = (pCVar8->current_chunk_)._M_len;
        pCVar8 = (ChunkIterator *)((long)pCVar8 + (ulong)bVar14 * -0x10 + 8);
        psVar12 = psVar12 + (ulong)bVar14 * -2 + 1;
      }
      it.chunk_iterator_.btree_reader_.navigator_.node_[2] =
           (CordRepBtree *)in_stack_fffffffffffffa20._0_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[3] =
           (CordRepBtree *)in_stack_fffffffffffffa20._8_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[4] =
           (CordRepBtree *)in_stack_fffffffffffffa20._16_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[5] =
           (CordRepBtree *)in_stack_fffffffffffffa20._24_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[6] =
           (CordRepBtree *)in_stack_fffffffffffffa20._32_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[7] =
           (CordRepBtree *)in_stack_fffffffffffffa20._40_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[8] =
           (CordRepBtree *)in_stack_fffffffffffffa20._48_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[9] =
           (CordRepBtree *)in_stack_fffffffffffffa20._56_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[10] =
           (CordRepBtree *)in_stack_fffffffffffffa20._64_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[0xb] =
           (CordRepBtree *)in_stack_fffffffffffffa20._72_8_;
      it.chunk_iterator_.current_chunk_._M_len = SUB168(in_stack_fffffffffffff9d8._0_16_,0);
      it.chunk_iterator_.current_chunk_._M_str = (char *)SUB168(in_stack_fffffffffffff9d8._0_16_,8);
      it.chunk_iterator_.current_leaf_ =
           (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffff9d8._16_8_;
      it.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffff9d8._24_8_;
      it.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffff9d8._32_8_;
      it.chunk_iterator_.btree_reader_.navigator_.height_ = in_stack_fffffffffffff9d8._40_4_;
      it.chunk_iterator_.btree_reader_.navigator_.index_[0] = in_stack_fffffffffffff9d8[0x2c];
      it.chunk_iterator_.btree_reader_.navigator_.index_[1] = in_stack_fffffffffffff9d8[0x2d];
      it.chunk_iterator_.btree_reader_.navigator_.index_[2] = in_stack_fffffffffffff9d8[0x2e];
      it.chunk_iterator_.btree_reader_.navigator_.index_[3] = in_stack_fffffffffffff9d8[0x2f];
      it.chunk_iterator_.btree_reader_.navigator_.index_[4] = in_stack_fffffffffffff9d8[0x30];
      it.chunk_iterator_.btree_reader_.navigator_.index_[5] = in_stack_fffffffffffff9d8[0x31];
      it.chunk_iterator_.btree_reader_.navigator_.index_[6] = in_stack_fffffffffffff9d8[0x32];
      it.chunk_iterator_.btree_reader_.navigator_.index_[7] = in_stack_fffffffffffff9d8[0x33];
      it.chunk_iterator_.btree_reader_.navigator_.index_[8] = in_stack_fffffffffffff9d8[0x34];
      it.chunk_iterator_.btree_reader_.navigator_.index_[9] = in_stack_fffffffffffff9d8[0x35];
      it.chunk_iterator_.btree_reader_.navigator_.index_[10] = in_stack_fffffffffffff9d8[0x36];
      it.chunk_iterator_.btree_reader_.navigator_.index_[0xb] = in_stack_fffffffffffff9d8[0x37];
      it.chunk_iterator_.btree_reader_.navigator_.node_[0] =
           (CordRepBtree *)in_stack_fffffffffffff9d8._56_8_;
      it.chunk_iterator_.btree_reader_.navigator_.node_[1] =
           (CordRepBtree *)in_stack_fffffffffffff9d8._64_8_;
      needle_00._M_str = pcVar16;
      needle_00._M_len = local_290.chunk_iterator_.current_chunk_._M_len;
      FindImpl(&local_290,(Cord *)pCVar8,it,needle_00);
      memcpy(&local_328,&local_290,0x98);
      if ((local_328.bytes_remaining_ == 0) || (local_328.bytes_remaining_ < sVar13))
      goto LAB_00133938;
      memcpy(&local_3c0,&local_328,0x98);
      CharIterator::CharIterator((CharIterator *)&stack0xfffffffffffffba8,needle);
      if (local_3c0.bytes_remaining_ < local_290.chunk_iterator_.current_chunk_._M_len)
      goto LAB_00133d89;
      if (local_3c0.current_chunk_._M_len < local_290.chunk_iterator_.current_chunk_._M_len ||
          local_3c0.current_chunk_._M_len - local_290.chunk_iterator_.current_chunk_._M_len == 0) {
        if (local_290.chunk_iterator_.current_chunk_._M_len != 0) {
          if (((long)local_3c0.btree_reader_.navigator_.height_ < 0) ||
             (local_3c0.btree_reader_.navigator_.node_[local_3c0.btree_reader_.navigator_.height_]
              == (CordRepBtree *)0x0)) {
            local_3c0.bytes_remaining_ = 0;
          }
          else {
            ChunkIterator::AdvanceBytesBtree
                      (&local_3c0,local_290.chunk_iterator_.current_chunk_._M_len);
          }
        }
      }
      else {
        local_3c0.current_chunk_._M_str =
             local_3c0.current_chunk_._M_str + local_290.chunk_iterator_.current_chunk_._M_len;
        local_3c0.current_chunk_._M_len =
             local_3c0.current_chunk_._M_len - local_290.chunk_iterator_.current_chunk_._M_len;
        local_3c0.bytes_remaining_ =
             local_3c0.bytes_remaining_ - local_290.chunk_iterator_.current_chunk_._M_len;
      }
      if (in_stack_fffffffffffffbc0 < local_290.chunk_iterator_.current_chunk_._M_len)
      goto LAB_00133d89;
      if (in_stack_fffffffffffffba8 < local_290.chunk_iterator_.current_chunk_._M_len ||
          in_stack_fffffffffffffba8 - local_290.chunk_iterator_.current_chunk_._M_len == 0) {
        if (local_290.chunk_iterator_.current_chunk_._M_len != 0) {
          if (((long)in_stack_fffffffffffffbd0 < 0) ||
             (*(long *)(&stack0xfffffffffffffbe0 + (long)in_stack_fffffffffffffbd0 * 8) == 0)) {
            in_stack_fffffffffffffbc0 = 0;
          }
          else {
            ChunkIterator::AdvanceBytesBtree
                      ((ChunkIterator *)&stack0xfffffffffffffba8,
                       local_290.chunk_iterator_.current_chunk_._M_len);
          }
        }
      }
      else {
        in_stack_fffffffffffffbb0 =
             in_stack_fffffffffffffbb0 + local_290.chunk_iterator_.current_chunk_._M_len;
        in_stack_fffffffffffffba8 =
             in_stack_fffffffffffffba8 - local_290.chunk_iterator_.current_chunk_._M_len;
        in_stack_fffffffffffffbc0 =
             in_stack_fffffffffffffbc0 - local_290.chunk_iterator_.current_chunk_._M_len;
      }
      memset(local_1f8,0,0x98);
      local_1d0 = 0xffffffff;
      pCVar8 = &local_3c0;
      psVar12 = (size_t *)&stack0xfffffffffffff9d8;
      for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
        *psVar12 = (pCVar8->current_chunk_)._M_len;
        pCVar8 = (ChunkIterator *)((long)pCVar8 + ((ulong)bVar14 * -2 + 1) * 8);
        psVar12 = psVar12 + (ulong)bVar14 * -2 + 1;
      }
      puVar9 = local_1f8;
      puVar11 = (undefined8 *)&stack0xfffffffffffffb08;
      for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar11 = *puVar9;
        puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
        puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
      }
      puVar9 = (undefined8 *)&stack0xfffffffffffffba8;
      puVar11 = (undefined8 *)&stack0xfffffffffffffa70;
      for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar11 = *puVar9;
        puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
        puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
      }
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] =
           (CordRepBtree *)in_stack_fffffffffffffa70._0_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[4] =
           (CordRepBtree *)in_stack_fffffffffffffa70._8_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[5] =
           (CordRepBtree *)in_stack_fffffffffffffa70._16_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] =
           (CordRepBtree *)in_stack_fffffffffffffa70._24_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[7] =
           (CordRepBtree *)in_stack_fffffffffffffa70._32_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[8] =
           (CordRepBtree *)in_stack_fffffffffffffa70._40_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[9] =
           (CordRepBtree *)in_stack_fffffffffffffa70._48_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[10] =
           (CordRepBtree *)in_stack_fffffffffffffa70._56_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[0xb] =
           (CordRepBtree *)in_stack_fffffffffffffa70._64_8_;
      haystack.chunk_iterator_.current_chunk_._M_len = SUB168(in_stack_fffffffffffffa20._0_16_,0);
      haystack.chunk_iterator_.current_chunk_._M_str =
           (char *)SUB168(in_stack_fffffffffffffa20._0_16_,8);
      haystack.chunk_iterator_.current_leaf_ =
           (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffffa20._16_8_;
      haystack.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffffa20._24_8_;
      haystack.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffffa20._32_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.height_ = in_stack_fffffffffffffa20._40_4_;
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[0] = in_stack_fffffffffffffa20[0x2c];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[1] = in_stack_fffffffffffffa20[0x2d];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[2] = in_stack_fffffffffffffa20[0x2e];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[3] = in_stack_fffffffffffffa20[0x2f];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[4] = in_stack_fffffffffffffa20[0x30];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[5] = in_stack_fffffffffffffa20[0x31];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[6] = in_stack_fffffffffffffa20[0x32];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[7] = in_stack_fffffffffffffa20[0x33];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[8] = in_stack_fffffffffffffa20[0x34];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[9] = in_stack_fffffffffffffa20[0x35];
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[10] = in_stack_fffffffffffffa20[0x36]
      ;
      haystack.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
           in_stack_fffffffffffffa20[0x37];
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[0] =
           (CordRepBtree *)in_stack_fffffffffffffa20._56_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[1] =
           (CordRepBtree *)in_stack_fffffffffffffa20._64_8_;
      haystack.chunk_iterator_.btree_reader_.navigator_.node_[2] =
           (CordRepBtree *)in_stack_fffffffffffffa20._72_8_;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[3] = (CordRepBtree *)pcVar16;
      needle_end.chunk_iterator_.current_chunk_._M_len = SUB168(in_stack_fffffffffffffb50._0_16_,0);
      needle_end.chunk_iterator_.current_chunk_._M_str =
           (char *)SUB168(in_stack_fffffffffffffb50._0_16_,8);
      needle_end.chunk_iterator_.current_leaf_ =
           (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffffb50._16_8_;
      needle_end.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffffb50._24_8_;
      needle_end.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffffb50._32_8_;
      needle_end.chunk_iterator_.btree_reader_.navigator_.height_ = in_stack_fffffffffffffb50._40_4_
      ;
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[0] =
           in_stack_fffffffffffffb50[0x2c];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[1] =
           in_stack_fffffffffffffb50[0x2d];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[2] =
           in_stack_fffffffffffffb50[0x2e];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[3] =
           in_stack_fffffffffffffb50[0x2f];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[4] =
           in_stack_fffffffffffffb50[0x30];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[5] =
           in_stack_fffffffffffffb50[0x31];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[6] =
           in_stack_fffffffffffffb50[0x32];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[7] =
           in_stack_fffffffffffffb50[0x33];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[8] =
           in_stack_fffffffffffffb50[0x34];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[9] =
           in_stack_fffffffffffffb50[0x35];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[10] =
           in_stack_fffffffffffffb50[0x36];
      needle_end.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
           in_stack_fffffffffffffb50[0x37];
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[0] =
           (CordRepBtree *)in_stack_fffffffffffffb50._56_8_;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[1] =
           (CordRepBtree *)in_stack_fffffffffffffb50._64_8_;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[2] =
           (CordRepBtree *)in_stack_fffffffffffffb50._72_8_;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[4] =
           (CordRepBtree *)in_stack_fffffffffffffba8;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[5] =
           (CordRepBtree *)in_stack_fffffffffffffbb0;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[6] =
           (CordRepBtree *)in_stack_fffffffffffffbb8;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[7] =
           (CordRepBtree *)in_stack_fffffffffffffbc0;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[8] =
           (CordRepBtree *)in_stack_fffffffffffffbc8;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_[9]._0_4_ = in_stack_fffffffffffffbd0
      ;
      needle_end.chunk_iterator_.btree_reader_.navigator_.node_._76_20_ = in_stack_fffffffffffffbd4;
      bVar2 = anon_unknown_74::IsSubcordInCordAt
                        (haystack,(CharIterator)in_stack_fffffffffffffab8,needle_end);
      if (bVar2) {
LAB_00133b39:
        memcpy(__return_storage_ptr__,&local_328,0x98);
        iVar4 = 1;
      }
      else {
        if (local_328.bytes_remaining_ == 0) goto LAB_00133d89;
        if (local_328.current_chunk_._M_len < 2) {
          if (((long)local_328.btree_reader_.navigator_.height_ < 0) ||
             (local_328.btree_reader_.navigator_.node_[local_328.btree_reader_.navigator_.height_]
              == (CordRepBtree *)0x0)) {
            local_328.bytes_remaining_ = 0;
          }
          else {
            ChunkIterator::AdvanceBytesBtree(&local_328,1);
          }
        }
        else {
          local_328.current_chunk_._M_str = local_328.current_chunk_._M_str + 1;
          local_328.current_chunk_._M_len = local_328.current_chunk_._M_len - 1;
          local_328.bytes_remaining_ = local_328.bytes_remaining_ - 1;
        }
        iVar4 = 3;
        if ((sVar13 <= local_328.bytes_remaining_) &&
           (iVar4 = 0, local_328.bytes_remaining_ == sVar13)) {
          memcpy(&local_290,&local_328,0x98);
          CharIterator::CharIterator(&local_c8,needle);
          memset(local_160,0,0x98);
          local_138 = 0xffffffff;
          pCVar10 = &local_290;
          psVar12 = (size_t *)&stack0xfffffffffffff9d8;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *psVar12 = (pCVar10->chunk_iterator_).current_chunk_._M_len;
            pCVar10 = (CharIterator *)((long)pCVar10 + ((ulong)bVar14 * -2 + 1) * 8);
            psVar12 = psVar12 + (ulong)bVar14 * -2 + 1;
          }
          puVar9 = local_160;
          puVar11 = (undefined8 *)&stack0xfffffffffffffb08;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar11 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar14 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
          }
          pCVar10 = &local_c8;
          psVar12 = (size_t *)&stack0xfffffffffffffa70;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *psVar12 = (pCVar10->chunk_iterator_).current_chunk_._M_len;
            pCVar10 = (CharIterator *)((long)pCVar10 + ((ulong)bVar14 * -2 + 1) * 8);
            psVar12 = psVar12 + (ulong)bVar14 * -2 + 1;
          }
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[3] =
               (CordRepBtree *)in_stack_fffffffffffffa70._0_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[4] =
               (CordRepBtree *)in_stack_fffffffffffffa70._8_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[5] =
               (CordRepBtree *)in_stack_fffffffffffffa70._16_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[6] =
               (CordRepBtree *)in_stack_fffffffffffffa70._24_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[7] =
               (CordRepBtree *)in_stack_fffffffffffffa70._32_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[8] =
               (CordRepBtree *)in_stack_fffffffffffffa70._40_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[9] =
               (CordRepBtree *)in_stack_fffffffffffffa70._48_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[10] =
               (CordRepBtree *)in_stack_fffffffffffffa70._56_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[0xb] =
               (CordRepBtree *)in_stack_fffffffffffffa70._64_8_;
          haystack_00.chunk_iterator_.current_chunk_._M_len =
               SUB168(in_stack_fffffffffffffa20._0_16_,0);
          haystack_00.chunk_iterator_.current_chunk_._M_str =
               (char *)SUB168(in_stack_fffffffffffffa20._0_16_,8);
          haystack_00.chunk_iterator_.current_leaf_ =
               (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffffa20._16_8_;
          haystack_00.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffffa20._24_8_;
          haystack_00.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffffa20._32_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.height_ =
               in_stack_fffffffffffffa20._40_4_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[0] =
               in_stack_fffffffffffffa20[0x2c];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[1] =
               in_stack_fffffffffffffa20[0x2d];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[2] =
               in_stack_fffffffffffffa20[0x2e];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[3] =
               in_stack_fffffffffffffa20[0x2f];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[4] =
               in_stack_fffffffffffffa20[0x30];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[5] =
               in_stack_fffffffffffffa20[0x31];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[6] =
               in_stack_fffffffffffffa20[0x32];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[7] =
               in_stack_fffffffffffffa20[0x33];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[8] =
               in_stack_fffffffffffffa20[0x34];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[9] =
               in_stack_fffffffffffffa20[0x35];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[10] =
               in_stack_fffffffffffffa20[0x36];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
               in_stack_fffffffffffffa20[0x37];
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[0] =
               (CordRepBtree *)in_stack_fffffffffffffa20._56_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[1] =
               (CordRepBtree *)in_stack_fffffffffffffa20._64_8_;
          haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[2] =
               (CordRepBtree *)in_stack_fffffffffffffa20._72_8_;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[3] = (CordRepBtree *)pcVar16;
          needle_end_00.chunk_iterator_.current_chunk_._M_len =
               SUB168(in_stack_fffffffffffffb50._0_16_,0);
          needle_end_00.chunk_iterator_.current_chunk_._M_str =
               (char *)SUB168(in_stack_fffffffffffffb50._0_16_,8);
          needle_end_00.chunk_iterator_.current_leaf_ =
               (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffffb50._16_8_;
          needle_end_00.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffffb50._24_8_;
          needle_end_00.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffffb50._32_8_;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.height_ =
               in_stack_fffffffffffffb50._40_4_;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[0] =
               in_stack_fffffffffffffb50[0x2c];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[1] =
               in_stack_fffffffffffffb50[0x2d];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[2] =
               in_stack_fffffffffffffb50[0x2e];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[3] =
               in_stack_fffffffffffffb50[0x2f];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[4] =
               in_stack_fffffffffffffb50[0x30];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[5] =
               in_stack_fffffffffffffb50[0x31];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[6] =
               in_stack_fffffffffffffb50[0x32];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[7] =
               in_stack_fffffffffffffb50[0x33];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[8] =
               in_stack_fffffffffffffb50[0x34];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[9] =
               in_stack_fffffffffffffb50[0x35];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[10] =
               in_stack_fffffffffffffb50[0x36];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
               in_stack_fffffffffffffb50[0x37];
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[0] =
               (CordRepBtree *)in_stack_fffffffffffffb50._56_8_;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[1] =
               (CordRepBtree *)in_stack_fffffffffffffb50._64_8_;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[2] =
               (CordRepBtree *)in_stack_fffffffffffffb50._72_8_;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[4] =
               (CordRepBtree *)in_stack_fffffffffffffba8;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[5] =
               (CordRepBtree *)in_stack_fffffffffffffbb0;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[6] =
               (CordRepBtree *)in_stack_fffffffffffffbb8;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[7] =
               (CordRepBtree *)in_stack_fffffffffffffbc0;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[8] =
               (CordRepBtree *)in_stack_fffffffffffffbc8;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[9]._0_4_ =
               in_stack_fffffffffffffbd0;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_._76_20_ =
               in_stack_fffffffffffffbd4;
          bVar2 = anon_unknown_74::IsSubcordInCordAt
                            (haystack_00,(CharIterator)in_stack_fffffffffffffab8,needle_end_00);
          iVar4 = 3;
          if (bVar2) goto LAB_00133b39;
        }
      }
    } while (iVar4 == 0);
    if (iVar4 != 3) {
      return __return_storage_ptr__;
    }
  }
LAB_00133938:
  memset(__return_storage_ptr__,0,0x98);
  (__return_storage_ptr__->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::Find(const absl::Cord& needle) const {
  if (needle.empty()) {
    return char_begin();
  }
  const auto needle_size = needle.size();
  if (needle_size > size()) {
    return char_end();
  }
  if (needle_size == size()) {
    return *this == needle ? char_begin() : char_end();
  }
  const auto needle_chunk = Cord::ChunkRemaining(needle.char_begin());
  auto haystack_it = char_begin();
  while (true) {
    haystack_it = FindImpl(haystack_it, needle_chunk);
    if (haystack_it == char_end() ||
        haystack_it.chunk_iterator_.bytes_remaining_ < needle_size) {
      break;
    }
    // We found the first chunk of `needle` at `haystack_it` but not the entire
    // subcord. Advance past the first chunk and check for the remainder.
    auto haystack_advanced_it = haystack_it;
    auto needle_it = needle.char_begin();
    Cord::Advance(&haystack_advanced_it, needle_chunk.size());
    Cord::Advance(&needle_it, needle_chunk.size());
    if (IsSubcordInCordAt(haystack_advanced_it, needle_it, needle.char_end())) {
      return haystack_it;
    }
    Cord::Advance(&haystack_it, 1);
    if (haystack_it.chunk_iterator_.bytes_remaining_ < needle_size) {
      break;
    }
    if (haystack_it.chunk_iterator_.bytes_remaining_ == needle_size) {
      // Special case, if there is exactly `needle_size` bytes remaining, the
      // subcord is either at `haystack_it` or not at all.
      if (IsSubcordInCordAt(haystack_it, needle)) {
        return haystack_it;
      }
      break;
    }
  }
  return char_end();
}